

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O2

void google::protobuf::compiler::cpp::ListAllFields
               (Descriptor *d,
               vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               *fields)

{
  int i;
  long lVar1;
  int i_1;
  long lVar2;
  FieldDescriptor *local_30;
  
  lVar2 = 0;
  for (lVar1 = 0; lVar1 < *(int *)(d + 0x70); lVar1 = lVar1 + 1) {
    ListAllFields((Descriptor *)(*(long *)(d + 0x38) + lVar2),fields);
    lVar2 = lVar2 + 0x90;
  }
  lVar1 = 0;
  for (lVar2 = 0; lVar2 < *(int *)(d + 0x7c); lVar2 = lVar2 + 1) {
    local_30 = (FieldDescriptor *)(*(long *)(d + 0x50) + lVar1);
    std::
    vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
    ::emplace_back<google::protobuf::FieldDescriptor_const*>
              ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                *)fields,&local_30);
    lVar1 = lVar1 + 0x98;
  }
  lVar1 = 0;
  for (lVar2 = 0; lVar2 < *(int *)(d + 0x68); lVar2 = lVar2 + 1) {
    local_30 = (FieldDescriptor *)(*(long *)(d + 0x28) + lVar1);
    std::
    vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
    ::emplace_back<google::protobuf::FieldDescriptor_const*>
              ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                *)fields,&local_30);
    lVar1 = lVar1 + 0x98;
  }
  return;
}

Assistant:

void ListAllFields(const Descriptor* d,
                   std::vector<const FieldDescriptor*>* fields) {
  // Collect sub messages
  for (int i = 0; i < d->nested_type_count(); i++) {
    ListAllFields(d->nested_type(i), fields);
  }
  // Collect message level extensions.
  for (int i = 0; i < d->extension_count(); i++) {
    fields->push_back(d->extension(i));
  }
  // Add types of fields necessary
  for (int i = 0; i < d->field_count(); i++) {
    fields->push_back(d->field(i));
  }
}